

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_long_long>_>::findBucketWithHash<QString>
          (Data<QHashPrivate::Node<QString,_long_long>_> *this,QString *key,size_t hash)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  char16_t *pcVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  Span *pSVar8;
  Span *pSVar9;
  ulong uVar10;
  QStringView rhs;
  Bucket BVar11;
  QStringView lhs;
  
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  uVar10 = uVar2 - 1 & hash;
  pSVar8 = pSVar3 + (uVar10 >> 7);
  uVar10 = (ulong)((uint)uVar10 & 0x7f);
  pcVar4 = (key->d).ptr;
  lVar5 = (key->d).size;
  do {
    bVar1 = pSVar8->offsets[uVar10];
    if (bVar1 == 0xff) {
LAB_003e48bb:
      bVar7 = false;
    }
    else {
      lVar6 = *(long *)(pSVar8->entries[bVar1].storage.data + 0x10);
      if (lVar6 == lVar5) {
        rhs.m_data = pcVar4;
        rhs.m_size = lVar5;
        lhs.m_data = *(storage_type_conflict **)(pSVar8->entries[bVar1].storage.data + 8);
        lhs.m_size = lVar6;
        bVar7 = QtPrivate::equalStrings(lhs,rhs);
        if (bVar7) goto LAB_003e48bb;
      }
      uVar10 = uVar10 + 1;
      bVar7 = true;
      if (uVar10 == 0x80) {
        pSVar9 = pSVar8 + 1;
        pSVar8 = pSVar3;
        if (((long)pSVar9 - (long)pSVar3 >> 4) * -0x71c71c71c71c71c7 - (uVar2 >> 7) != 0) {
          pSVar8 = pSVar9;
        }
        uVar10 = 0;
      }
    }
    if (!bVar7) {
      BVar11.index = uVar10;
      BVar11.span = pSVar8;
      return BVar11;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }